

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O1

int password_verify(char *password,char *hash)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  char output [61];
  byte local_58 [72];
  
  if (password == (char *)0x0) {
    iVar5 = -1;
    if (-1 < msgno) {
      password_verify_cold_4();
    }
  }
  else if (hash == (char *)0x0) {
    iVar5 = -1;
    if (-1 < msgno) {
      password_verify_cold_3();
    }
  }
  else {
    if (0 < msgno) {
      fprintf(_stderr,"password_verify: parameters\n  password => %s\n  hash     => %s\n",password,
              hash);
    }
    local_58[0x30] = 0;
    local_58[0x31] = 0;
    local_58[0x32] = 0;
    local_58[0x33] = 0;
    local_58[0x34] = 0;
    local_58[0x35] = 0;
    local_58[0x36] = 0;
    local_58[0x37] = 0;
    local_58[0x38] = 0;
    local_58[0x39] = 0;
    local_58[0x3a] = 0;
    local_58[0x3b] = 0;
    local_58[0x3c] = 0;
    local_58[0x20] = 0;
    local_58[0x21] = 0;
    local_58[0x22] = 0;
    local_58[0x23] = 0;
    local_58[0x24] = 0;
    local_58[0x25] = 0;
    local_58[0x26] = 0;
    local_58[0x27] = 0;
    local_58[0x28] = 0;
    local_58[0x29] = 0;
    local_58[0x2a] = 0;
    local_58[0x2b] = 0;
    local_58[0x2c] = 0;
    local_58[0x2d] = 0;
    local_58[0x2e] = 0;
    local_58[0x2f] = 0;
    local_58[0x10] = 0;
    local_58[0x11] = 0;
    local_58[0x12] = 0;
    local_58[0x13] = 0;
    local_58[0x14] = 0;
    local_58[0x15] = 0;
    local_58[0x16] = 0;
    local_58[0x17] = 0;
    local_58[0x18] = 0;
    local_58[0x19] = 0;
    local_58[0x1a] = 0;
    local_58[0x1b] = 0;
    local_58[0x1c] = 0;
    local_58[0x1d] = 0;
    local_58[0x1e] = 0;
    local_58[0x1f] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
    local_58[0xe] = 0;
    local_58[0xf] = 0;
    pcVar2 = _crypt_blowfish_rn(password,hash,(char *)local_58,0x3d);
    if (pcVar2 == (char *)0x0) {
      iVar5 = -1;
      if (0 < msgno) {
        password_verify_cold_2();
      }
    }
    else {
      sVar3 = strlen((char *)local_58);
      sVar4 = strlen(hash);
      if ((sVar3 < 0xe) || (sVar3 != sVar4)) {
        iVar5 = -1;
        if (0 < msgno) {
          password_verify_cold_1();
        }
      }
      else {
        bVar1 = 0;
        sVar4 = 0;
        do {
          bVar1 = bVar1 | hash[sVar4] ^ local_58[sVar4];
          sVar4 = sVar4 + 1;
        } while (sVar3 != sVar4);
        iVar5 = -(uint)(bVar1 != 0);
      }
    }
  }
  return iVar5;
}

Assistant:

int
password_verify(const char *password, const char *hash)
{
    char output[BLOWFISH_LEN+1];
    size_t i, len;
    int status = 0;

    if (!password) {
        msg_error(verify, "missing password\n");
        return -1;
    }
    if (!hash) {
        msg_error(verify, "missing hash\n");
        return -1;
    }

    msg_verbose(verify, "parameters\n"
                "  password => %s\n"
                "  hash     => %s\n",
                password, hash);

    memset(output, 0, sizeof(output));

    if (_crypt_blowfish_rn(password, hash, output, sizeof(output)) == NULL) {
        msg_verbose(verify, "blowfish run.\n");
        return -1;
    }

    len = strlen(output);
    if (len != strlen(hash) || len <= 13) {
        msg_verbose(verify, "hash length.\n");
        return -1;
    }

    for (i = 0; i < len; i++) {
        status |= (output[i] ^ hash[i]);
    }

    if (status != 0) {
        return -1;
    }

    return 0;
}